

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O2

bool QInternalMimeData::hasFormatHelper(QString *mimeType,QMimeData *data)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)data + 0x60))(data,mimeType);
  bVar2 = true;
  if (cVar1 == '\0') {
    local_48.d = (Data *)0x16;
    local_48.ptr = (QString *)0x5d28c4;
    bVar2 = ::operator==(mimeType,(QLatin1StringView *)&local_48);
    if (bVar2) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      imageWriteMimeFormats();
      puVar4 = (undefined1 *)0xffffffffffffffff;
      lVar3 = 0;
      do {
        puVar4 = puVar4 + 1;
        bVar2 = puVar4 < (ulong)local_48.size;
        if ((ulong)local_48.size <= puVar4) break;
        cVar1 = (**(code **)(*(long *)data + 0x60))
                          (data,(char *)((long)&((local_48.ptr)->d).d + lVar3));
        lVar3 = lVar3 + 0x18;
      } while (cVar1 == '\0');
    }
    else {
      cVar1 = QString::startsWith((QLatin1String *)mimeType,6);
      if ((cVar1 == '\0') || (cVar1 = QMimeData::hasImage(), cVar1 == '\0')) {
        bVar2 = false;
        goto LAB_002c380a;
      }
      imageWriteMimeFormats();
      bVar2 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&local_48,mimeType,CaseSensitive);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
LAB_002c380a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QInternalMimeData::hasFormatHelper(const QString &mimeType, const QMimeData *data)
{

    bool foundFormat = data->hasFormat(mimeType);
    if (!foundFormat) {
        if (mimeType == "application/x-qt-image"_L1) {
            // check all supported image formats
            QStringList imageFormats = imageWriteMimeFormats();
            for (int i = 0; i < imageFormats.size(); ++i) {
                if ((foundFormat = data->hasFormat(imageFormats.at(i))))
                    break;
            }
        } else if (mimeType.startsWith("image/"_L1)) {
            return data->hasImage() && imageWriteMimeFormats().contains(mimeType);
        }
    }
    return foundFormat;
}